

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

void __thiscall
QPDF::JSONReactor::setObjectDescription(JSONReactor *this,QPDFObjectHandle *oh,JSON *value)

{
  QPDF *qpdf_p;
  bool bVar1;
  element_type *__v;
  JSON_Descr *pJVar2;
  QPDFObject *this_00;
  qpdf_offset_t offset;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  JSON_Descr local_90;
  undefined1 local_60 [16];
  undefined1 local_50 [8];
  JSON_Descr j_descr;
  JSON *value_local;
  QPDFObjectHandle *oh_local;
  JSONReactor *this_local;
  
  j_descr.object.field_2._8_8_ = value;
  __v = std::
        __shared_ptr_access<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator*((__shared_ptr_access<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)&this->descr);
  pJVar2 = std::
           get<QPDFObject::JSON_Descr,std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>
                     (__v);
  QPDFObject::JSON_Descr::JSON_Descr((JSON_Descr *)local_50,pJVar2);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &j_descr.input.
                           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount,&this->cur_object);
  if (bVar1) {
    std::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    shared_ptr(&local_a0,
               (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_50);
    QPDFObject::JSON_Descr::JSON_Descr(&local_90,&local_a0,&this->cur_object);
    std::
    make_shared<std::variant<std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>,QPDFObject::JSON_Descr>
              ((JSON_Descr *)local_60);
    std::
    shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
    ::operator=(&this->descr,
                (shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
                 *)local_60);
    std::
    shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
    ::~shared_ptr((shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
                   *)local_60);
    QPDFObject::JSON_Descr::~JSON_Descr(&local_90);
    std::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~shared_ptr(&local_a0);
  }
  this_00 = QPDFObjectHandle::getObjectPtr(oh);
  qpdf_p = this->pdf;
  offset = JSON::getStart((JSON *)j_descr.object.field_2._8_8_);
  QPDFObject::setDescription(this_00,qpdf_p,&this->descr,offset);
  QPDFObject::JSON_Descr::~JSON_Descr((JSON_Descr *)local_50);
  return;
}

Assistant:

void
QPDF::JSONReactor::setObjectDescription(QPDFObjectHandle& oh, JSON const& value)
{
    auto j_descr = std::get<QPDFObject::JSON_Descr>(*descr);
    if (j_descr.object != cur_object) {
        descr = std::make_shared<QPDFObject::Description>(
            QPDFObject::JSON_Descr(j_descr.input, cur_object));
    }

    oh.getObjectPtr()->setDescription(&pdf, descr, value.getStart());
}